

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subprocess_test.cc
# Opt level: O0

void __thiscall SubprocessTestConsole::SubprocessTestConsole(SubprocessTestConsole *this)

{
  SubprocessTestConsole *this_local;
  
  anon_unknown.dwarf_cd35c::SubprocessTest::SubprocessTest(&this->super_SubprocessTest);
  (this->super_SubprocessTest).super_Test._vptr_Test =
       (_func_int **)&PTR__SubprocessTestConsole_002a8e78;
  return;
}

Assistant:

TEST_F(SubprocessTest, Console) {
  // Skip test if we don't have the console ourselves.
  if (isatty(0) && isatty(1) && isatty(2)) {
    Subprocess* subproc =
        subprocs_.Add("test -t 0 -a -t 1 -a -t 2", /*use_console=*/true);
    ASSERT_NE((Subprocess*)0, subproc);

    subprocs_.ResetTokenAvailable();
    while (!subproc->Done()) {
      subprocs_.DoWork(NULL);
    }
    ASSERT_FALSE(subprocs_.IsTokenAvailable());

    EXPECT_EQ(ExitSuccess, subproc->Finish());
  }
}